

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::replace_fragment_output(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t id;
  size_t sVar2;
  CompilerError *pCVar3;
  char (*in_R8) [2];
  allocator local_a9;
  string local_a8;
  allocator local_71;
  string local_70;
  string local_50;
  SPIRType *local_30;
  SPIRType *type;
  mapped_type *pmStack_20;
  uint32_t location;
  Decoration *m;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  m = (Decoration *)var;
  var_local = (SPIRVariable *)this;
  pmStack_20 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](&(this->super_Compiler).ir.meta,&(var->super_IVariant).self);
  type._4_4_ = 0;
  bVar1 = Bitset::get(&(pmStack_20->decoration).decoration_flags,0x1e);
  if (bVar1) {
    type._4_4_ = (pmStack_20->decoration).location;
  }
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&(m->alias)._M_string_length + 4));
  local_30 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
  bVar1 = VectorView<unsigned_int>::empty(&(local_30->array).super_VectorView<unsigned_int>);
  if (bVar1) {
    join<char_const(&)[13],unsigned_int&,char_const(&)[2]>
              (&local_50,(spirv_cross *)"gl_FragData[",(char (*) [13])((long)&type + 4),
               (uint *)0x490482,in_R8);
    ::std::__cxx11::string::operator=((string *)pmStack_20,(string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    bVar1 = is_legacy_es(this);
    if ((bVar1) && (type._4_4_ != 0)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_70,"GL_EXT_draw_buffers",&local_71);
      require_extension_internal(this,&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
  }
  else {
    sVar2 = VectorView<unsigned_int>::size(&(local_30->array).super_VectorView<unsigned_int>);
    if (sVar2 != 1) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar3,
                 "Array-of-array output variable used. This cannot be implemented in legacy GLSL.");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::__cxx11::string::operator=((string *)pmStack_20,"gl_FragData");
    if (type._4_4_ != 0) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar3,
                 "Arrayed output variable used, but location is not 0. This is unimplemented in SPIRV-Cross."
                );
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar1 = is_legacy_es(this);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_a8,"GL_EXT_draw_buffers",&local_a9);
      require_extension_internal(this,&local_a8);
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
  }
  (m->hlsl_semantic).field_2._M_local_buf[8] = '\x01';
  return;
}

Assistant:

void CompilerGLSL::replace_fragment_output(SPIRVariable &var)
{
	auto &m = ir.meta[var.self].decoration;
	uint32_t location = 0;
	if (m.decoration_flags.get(DecorationLocation))
		location = m.location;

	// If our variable is arrayed, we must not emit the array part of this as the SPIR-V will
	// do the access chain part of this for us.
	auto &type = get<SPIRType>(var.basetype);

	if (type.array.empty())
	{
		// Redirect the write to a specific render target in legacy GLSL.
		m.alias = join("gl_FragData[", location, "]");

		if (is_legacy_es() && location != 0)
			require_extension_internal("GL_EXT_draw_buffers");
	}
	else if (type.array.size() == 1)
	{
		// If location is non-zero, we probably have to add an offset.
		// This gets really tricky since we'd have to inject an offset in the access chain.
		// FIXME: This seems like an extremely odd-ball case, so it's probably fine to leave it like this for now.
		m.alias = "gl_FragData";
		if (location != 0)
			SPIRV_CROSS_THROW("Arrayed output variable used, but location is not 0. "
			                  "This is unimplemented in SPIRV-Cross.");

		if (is_legacy_es())
			require_extension_internal("GL_EXT_draw_buffers");
	}
	else
		SPIRV_CROSS_THROW("Array-of-array output variable used. This cannot be implemented in legacy GLSL.");

	var.compat_builtin = true; // We don't want to declare this variable, but use the name as-is.
}